

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_ecmult_multi(secp256k1_scratch *scratch,secp256k1_ecmult_multi_func ecmult_multi)

{
  size_t sVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  secp256k1_scalar *psVar9;
  long lVar10;
  secp256k1_gej *r_00;
  secp256k1_ge *psVar11;
  ulong uVar12;
  secp256k1_strauss_point_state *psVar13;
  secp256k1_gej *psVar14;
  secp256k1_strauss_point_state *error_callback;
  secp256k1_ge *psVar15;
  uint64_t *puVar16;
  code *cb;
  secp256k1_scalar **ppsVar17;
  secp256k1_scalar **ppsVar18;
  ulong uVar19;
  long lVar20;
  byte bVar21;
  ecmult_multi_data data;
  secp256k1_gej r;
  secp256k1_gej t1p;
  secp256k1_gej ptgj;
  secp256k1_scalar t1;
  secp256k1_scalar t0;
  secp256k1_ge ptg;
  secp256k1_gej expected;
  secp256k1_scalar tmp2;
  secp256k1_scalar tmp1;
  secp256k1_fe aux [8];
  secp256k1_gej r2;
  secp256k1_ge pre_a [8];
  secp256k1_ge ptg_4;
  secp256k1_strauss_point_state ps [1];
  secp256k1_ge pt [32];
  secp256k1_scalar *local_1b90;
  secp256k1_ge *local_1b88;
  secp256k1_scalar *local_1b80;
  ulong local_1b78;
  ulong local_1b70;
  ulong local_1b68;
  ulong local_1b60;
  ulong local_1b58;
  ulong local_1b50;
  secp256k1_gej local_1b48;
  secp256k1_gej local_1ac8;
  secp256k1_gej local_1a48;
  secp256k1_scalar local_19c0;
  secp256k1_strauss_state local_19a0;
  secp256k1_scalar local_1988;
  secp256k1_gej local_1968;
  secp256k1_gej local_18e8;
  secp256k1_scalar local_1868;
  secp256k1_scalar local_1848;
  undefined8 local_1828;
  undefined8 uStack_1820;
  undefined8 local_1818;
  undefined8 uStack_1810;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  secp256k1_scalar local_1468;
  secp256k1_scalar local_1448;
  secp256k1_fe local_1428 [8];
  secp256k1_gej local_12e8;
  secp256k1_gej local_1268 [5];
  secp256k1_ge local_fa0;
  secp256k1_strauss_point_state local_f48;
  secp256k1_ge local_b38;
  secp256k1_ge local_ae0 [31];
  
  bVar21 = 0;
  local_1b90 = &local_1868;
  ppsVar17 = &local_1b90;
  local_1b88 = &local_b38;
  error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
  cb = ecmult_multi_callback;
  psVar9 = (secp256k1_scalar *)0x0;
  psVar13 = (secp256k1_strauss_point_state *)scratch;
  iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                          (secp256k1_scalar *)0x0,ecmult_multi_callback,ppsVar17,0);
  if (iVar5 == 0) goto LAB_0016bb3b;
  if (0 < COUNT) {
    psVar9 = (secp256k1_scalar *)0x0;
    do {
      local_1b80 = psVar9;
      testutil_random_scalar_order(&local_1868);
      testutil_random_scalar_order(&local_1848);
      testutil_random_ge_test((secp256k1_ge *)&local_1968);
      local_1a48.infinity = (int)local_1968.z.n[0];
      local_1a48.x.n[4] = local_1968.x.n[4];
      local_1a48.x.n[2] = local_1968.x.n[2];
      local_1a48.x.n[3] = local_1968.x.n[3];
      local_1a48.x.n[0] = local_1968.x.n[0];
      local_1a48.x.n[1] = local_1968.x.n[1];
      local_1a48.y.n[4] = local_1968.y.n[4];
      local_1a48.y.n[2] = local_1968.y.n[2];
      local_1a48.y.n[3] = local_1968.y.n[3];
      local_1a48.y.n[0] = local_1968.y.n[0];
      local_1a48.y.n[1] = local_1968.y.n[1];
      local_1a48.z.n[0] = 1;
      local_1a48.z.n[3] = 0;
      local_1a48.z.n[4] = 0;
      local_1a48.z.n[1] = 0;
      local_1a48.z.n[2] = 0;
      psVar14 = &local_1968;
      psVar11 = &local_b38;
      for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
        (psVar11->x).n[0] = (psVar14->x).n[0];
        psVar14 = (secp256k1_gej *)((long)psVar14 + (ulong)bVar21 * -0x10 + 8);
        psVar11 = (secp256k1_ge *)((long)psVar11 + ((ulong)bVar21 * -2 + 1) * 8);
      }
      psVar11 = &secp256k1_ge_const_g;
      psVar15 = local_ae0;
      for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
        (psVar15->x).n[0] = (psVar11->x).n[0];
        psVar11 = (secp256k1_ge *)((long)psVar11 + ((ulong)bVar21 * -2 + 1) * 8);
        psVar15 = (secp256k1_ge *)((long)psVar15 + ((ulong)bVar21 * -2 + 1) * 8);
      }
      local_1ac8.x.n[0] = (uint64_t)local_1428;
      local_1ac8.x.n[1] = (uint64_t)local_1268;
      ppsVar18 = &local_1b90;
      local_1ac8.x.n[2] = (uint64_t)&local_f48;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1ac8,&local_12e8,1,&local_1a48,
                 &secp256k1_scalar_zero,&local_1868);
      error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cb = ecmult_multi_callback;
      psVar9 = &local_1868;
      psVar13 = (secp256k1_strauss_point_state *)scratch;
      ppsVar17 = ppsVar18;
      iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,&local_1868,
                              ecmult_multi_callback,ppsVar18,0);
      if (iVar5 == 0) goto LAB_0016bafa;
      secp256k1_gej_neg((secp256k1_gej *)&local_f48,&local_1b48);
      psVar9 = (secp256k1_scalar *)0x0;
      psVar13 = &local_f48;
      error_callback = &local_f48;
      secp256k1_gej_add_var
                ((secp256k1_gej *)&local_f48,(secp256k1_gej *)&local_f48,&local_12e8,
                 (secp256k1_fe *)0x0);
      if (local_f48.wnaf_na_1[0x1e] == 0) goto LAB_0016baff;
      local_1ac8.x.n[0] = (uint64_t)local_1428;
      local_1ac8.x.n[1] = (uint64_t)local_1268;
      local_1ac8.x.n[2] = (uint64_t)&local_f48;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1ac8,&local_12e8,1,&local_1a48,&local_1868,
                 &secp256k1_scalar_zero);
      error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar9 = &secp256k1_scalar_zero;
      cb = ecmult_multi_callback;
      psVar13 = (secp256k1_strauss_point_state *)scratch;
      iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                              &secp256k1_scalar_zero,ecmult_multi_callback,ppsVar18,1);
      if (iVar5 == 0) goto LAB_0016bb04;
      secp256k1_gej_neg((secp256k1_gej *)&local_f48,&local_1b48);
      psVar9 = (secp256k1_scalar *)0x0;
      psVar13 = &local_f48;
      error_callback = &local_f48;
      secp256k1_gej_add_var
                ((secp256k1_gej *)&local_f48,(secp256k1_gej *)&local_f48,&local_12e8,
                 (secp256k1_fe *)0x0);
      if (local_f48.wnaf_na_1[0x1e] == 0) goto LAB_0016bb09;
      psVar9 = &secp256k1_scalar_zero;
      error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cb = ecmult_multi_false_callback;
      ppsVar17 = &local_1b90;
      psVar13 = (secp256k1_strauss_point_state *)scratch;
      ppsVar18 = ppsVar17;
      iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                              &secp256k1_scalar_zero,ecmult_multi_false_callback,ppsVar17,1);
      if (iVar5 != 0) goto LAB_0016bb0e;
      local_1ac8.x.n[0] = (uint64_t)local_1428;
      local_1ac8.x.n[1] = (uint64_t)local_1268;
      local_1ac8.x.n[2] = (uint64_t)&local_f48;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1ac8,&local_12e8,1,&local_1a48,&local_1868,
                 &local_1848);
      error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar9 = &secp256k1_scalar_zero;
      cb = ecmult_multi_callback;
      psVar13 = (secp256k1_strauss_point_state *)scratch;
      ppsVar18 = ppsVar17;
      iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                              &secp256k1_scalar_zero,ecmult_multi_callback,ppsVar17,2);
      if (iVar5 == 0) goto LAB_0016bb13;
      secp256k1_gej_neg((secp256k1_gej *)&local_f48,&local_1b48);
      psVar9 = (secp256k1_scalar *)0x0;
      psVar13 = &local_f48;
      error_callback = &local_f48;
      secp256k1_gej_add_var
                ((secp256k1_gej *)&local_f48,(secp256k1_gej *)&local_f48,&local_12e8,
                 (secp256k1_fe *)0x0);
      if (local_f48.wnaf_na_1[0x1e] == 0) goto LAB_0016bb18;
      local_1ac8.x.n[0] = (uint64_t)local_1428;
      local_1ac8.x.n[1] = (uint64_t)local_1268;
      psVar9 = &local_1848;
      local_1ac8.x.n[2] = (uint64_t)&local_f48;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1ac8,&local_12e8,1,&local_1a48,&local_1868,psVar9
                );
      error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cb = ecmult_multi_callback;
      psVar13 = (secp256k1_strauss_point_state *)scratch;
      iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,psVar9,
                              ecmult_multi_callback,ppsVar17,1);
      if (iVar5 == 0) goto LAB_0016bb1d;
      secp256k1_gej_neg((secp256k1_gej *)&local_f48,&local_1b48);
      psVar13 = &local_f48;
      error_callback = &local_f48;
      secp256k1_gej_add_var
                ((secp256k1_gej *)&local_f48,(secp256k1_gej *)&local_f48,&local_12e8,
                 (secp256k1_fe *)0x0);
      psVar9 = local_1b80;
      if (local_f48.wnaf_na_1[0x1e] == 0) goto LAB_0016bb22;
      uVar7 = (int)local_1b80 + 1;
      psVar9 = (secp256k1_scalar *)(ulong)uVar7;
    } while ((int)uVar7 < COUNT);
    if (0 < COUNT) {
      psVar9 = (secp256k1_scalar *)0x0;
      do {
        lVar8 = 0;
        local_1b80 = psVar9;
        do {
          lVar20 = 0x50;
          psVar9 = &local_1868;
          do {
            testutil_random_scalar_order(psVar9);
            *(undefined4 *)((long)local_b38.x.n + lVar20) = 1;
            *(undefined8 *)((long)(&local_b38.x + -2) + lVar20) = 0;
            *(undefined8 *)((long)local_b38.x.n + lVar20 + -0x48) = 0;
            *(undefined8 *)((long)local_b38.x.n + lVar20 + -0x40) = 0;
            *(undefined8 *)((long)local_b38.x.n + lVar20 + -0x38) = 0;
            *(undefined8 *)((long)local_b38.x.n + lVar20 + -0x30) = 0;
            *(undefined8 *)((long)(&local_b38.x + -1) + lVar20) = 0;
            *(undefined8 *)((long)local_b38.x.n + lVar20 + -0x20) = 0;
            *(undefined8 *)((long)local_b38.x.n + lVar20 + -0x18) = 0;
            *(undefined8 *)((long)local_b38.x.n + lVar20 + -0x10) = 0;
            *(undefined8 *)((long)local_b38.x.n + lVar20 + -8) = 0;
            lVar20 = lVar20 + 0x58;
            psVar9 = psVar9 + 1;
          } while (lVar20 != 0xb50);
          error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
          psVar9 = &secp256k1_scalar_zero;
          cb = ecmult_multi_callback;
          ppsVar17 = &local_1b90;
          psVar13 = (secp256k1_strauss_point_state *)scratch;
          iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                                  &secp256k1_scalar_zero,ecmult_multi_callback,ppsVar17,
                                  (&DAT_00189600)[lVar8]);
          if (iVar5 == 0) goto LAB_0016bad2;
          if (local_1b48.infinity == 0) goto LAB_0016bad7;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        lVar8 = 0;
        do {
          psVar11 = &local_b38;
          lVar20 = 0;
          do {
            testutil_random_ge_test((secp256k1_ge *)&local_f48);
            psVar13 = &local_f48;
            psVar15 = psVar11;
            for (lVar10 = 0xb; lVar10 != 0; lVar10 = lVar10 + -1) {
              (psVar15->x).n[0] = ((secp256k1_fe *)psVar13->wnaf_na_1)->n[0];
              psVar13 = (secp256k1_strauss_point_state *)((long)psVar13 + (ulong)bVar21 * -0x10 + 8)
              ;
              psVar15 = (secp256k1_ge *)((long)psVar15 + ((ulong)bVar21 * -2 + 1) * 8);
            }
            *(undefined8 *)((long)local_1868.d + lVar20 + 0x10) = 0;
            *(undefined8 *)((long)local_1868.d + lVar20 + 0x18) = 0;
            *(undefined8 *)((long)local_1868.d + lVar20) = 0;
            *(undefined8 *)((long)local_1868.d + lVar20 + 8) = 0;
            lVar20 = lVar20 + 0x20;
            psVar11 = psVar11 + 1;
          } while (lVar20 != 0x400);
          error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
          psVar9 = &secp256k1_scalar_zero;
          cb = ecmult_multi_callback;
          ppsVar17 = &local_1b90;
          psVar13 = (secp256k1_strauss_point_state *)scratch;
          iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                                  &secp256k1_scalar_zero,ecmult_multi_callback,ppsVar17,
                                  (&DAT_00189600)[lVar8]);
          if (iVar5 == 0) goto LAB_0016badc;
          if (local_1b48.infinity == 0) goto LAB_0016bae1;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        lVar8 = 0;
        do {
          testutil_random_ge_test((secp256k1_ge *)&local_f48);
          lVar20 = 0x58;
          psVar9 = &local_1868;
          do {
            testutil_random_scalar_order(psVar9);
            secp256k1_scalar_negate(psVar9 + 1,psVar9);
            psVar13 = &local_f48;
            puVar16 = (uint64_t *)((long)(&local_b38)[-1].x.n + lVar20);
            for (lVar10 = 0xb; lVar10 != 0; lVar10 = lVar10 + -1) {
              *puVar16 = ((secp256k1_fe *)psVar13->wnaf_na_1)->n[0];
              psVar13 = (secp256k1_strauss_point_state *)((long)psVar13 + (ulong)bVar21 * -0x10 + 8)
              ;
              puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
            }
            psVar13 = &local_f48;
            puVar16 = (uint64_t *)((long)local_b38.x.n + lVar20);
            for (lVar10 = 0xb; lVar10 != 0; lVar10 = lVar10 + -1) {
              *puVar16 = ((secp256k1_fe *)psVar13->wnaf_na_1)->n[0];
              psVar13 = (secp256k1_strauss_point_state *)((long)psVar13 + (ulong)bVar21 * -0x10 + 8)
              ;
              puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
            }
            lVar20 = lVar20 + 0xb0;
            psVar9 = psVar9 + 2;
          } while (lVar20 != 0xb58);
          error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
          sVar1 = (&DAT_00189600)[lVar8];
          psVar9 = &secp256k1_scalar_zero;
          cb = ecmult_multi_callback;
          ppsVar17 = &local_1b90;
          psVar13 = (secp256k1_strauss_point_state *)scratch;
          iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                                  &secp256k1_scalar_zero,ecmult_multi_callback,ppsVar17,sVar1);
          if (iVar5 == 0) goto LAB_0016bae6;
          if (local_1b48.infinity == 0) goto LAB_0016baeb;
          testutil_random_scalar_order(&local_1868);
          lVar20 = 0x20;
          psVar11 = &local_b38;
          do {
            testutil_random_ge_test((secp256k1_ge *)&local_f48);
            uVar3 = local_1868.d[3];
            uVar2 = local_1868.d[1];
            *(uint64_t *)((long)local_18e8.z.n + lVar20 + 0x20) = local_1868.d[2];
            *(uint64_t *)((long)(&local_18e8.z + 1) + lVar20) = uVar3;
            *(uint64_t *)((long)local_18e8.z.n + lVar20 + 0x10) = local_1868.d[0];
            *(uint64_t *)((long)local_18e8.z.n + lVar20 + 0x18) = uVar2;
            *(uint64_t *)((long)local_1868.d + lVar20) = local_1868.d[0];
            *(uint64_t *)((long)local_1868.d + lVar20 + 8) = local_1868.d[1];
            *(uint64_t *)((long)local_1868.d + lVar20 + 0x10) = local_1868.d[2];
            *(uint64_t *)((long)local_1868.d + lVar20 + 0x18) = local_1868.d[3];
            psVar13 = &local_f48;
            psVar15 = psVar11;
            for (lVar10 = 0xb; lVar10 != 0; lVar10 = lVar10 + -1) {
              (psVar15->x).n[0] = ((secp256k1_fe *)psVar13->wnaf_na_1)->n[0];
              psVar13 = (secp256k1_strauss_point_state *)((long)psVar13 + (ulong)bVar21 * -0x10 + 8)
              ;
              psVar15 = (secp256k1_ge *)((long)psVar15 + (ulong)bVar21 * -0x10 + 8);
            }
            secp256k1_ge_neg(psVar11 + 1,psVar11);
            lVar20 = lVar20 + 0x40;
            psVar11 = psVar11 + 2;
          } while (lVar20 != 0x420);
          error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
          psVar9 = &secp256k1_scalar_zero;
          cb = ecmult_multi_callback;
          ppsVar17 = &local_1b90;
          psVar13 = (secp256k1_strauss_point_state *)scratch;
          iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                                  &secp256k1_scalar_zero,ecmult_multi_callback,ppsVar17,sVar1);
          if (iVar5 == 0) goto LAB_0016baf0;
          if (local_1b48.infinity == 0) goto LAB_0016baf5;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        testutil_random_ge_test((secp256k1_ge *)&local_f48);
        local_1868.d[2] = 0;
        local_1868.d[3] = 0;
        local_1868.d[0] = 0;
        local_1868.d[1] = 0;
        psVar13 = &local_f48;
        psVar11 = &local_b38;
        for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
          (psVar11->x).n[0] = ((secp256k1_fe *)psVar13->wnaf_na_1)->n[0];
          psVar13 = (secp256k1_strauss_point_state *)((long)psVar13 + (ulong)bVar21 * -0x10 + 8);
          psVar11 = (secp256k1_ge *)((long)psVar11 + ((ulong)bVar21 * -2 + 1) * 8);
        }
        lVar8 = 0x58;
        psVar9 = &local_1848;
        do {
          psVar13 = &local_f48;
          puVar16 = (uint64_t *)((long)local_b38.x.n + lVar8);
          for (lVar20 = 0xb; lVar20 != 0; lVar20 = lVar20 + -1) {
            *puVar16 = ((secp256k1_fe *)psVar13->wnaf_na_1)->n[0];
            psVar13 = (secp256k1_strauss_point_state *)((long)psVar13 + (ulong)bVar21 * -0x10 + 8);
            puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
          }
          testutil_random_scalar_order(psVar9);
          secp256k1_scalar_add(&local_1868,&local_1868,psVar9);
          secp256k1_scalar_negate(psVar9,psVar9);
          lVar8 = lVar8 + 0x58;
          psVar9 = psVar9 + 1;
        } while (lVar8 != 0xb00);
        error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
        psVar9 = &secp256k1_scalar_zero;
        cb = ecmult_multi_callback;
        ppsVar17 = &local_1b90;
        psVar13 = (secp256k1_strauss_point_state *)scratch;
        iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                                &secp256k1_scalar_zero,ecmult_multi_callback,ppsVar17,0x20);
        if (iVar5 == 0) goto LAB_0016bb27;
        psVar9 = local_1b80;
        if (local_1b48.infinity == 0) goto LAB_0016bb2c;
        uVar7 = (int)local_1b80 + 1;
        psVar9 = (secp256k1_scalar *)(ulong)uVar7;
      } while ((int)uVar7 < COUNT);
      if (0 < COUNT) {
        iVar5 = 0;
        do {
          local_1b48.infinity = 1;
          local_1b48.x.n[0] = 0;
          local_1b48.x.n[1] = 0;
          local_1b48.x.n[2] = 0;
          local_1b48.x.n[3] = 0;
          local_1b48.x.n[4] = 0;
          local_1b48.y.n[0] = 0;
          local_1b48.y.n[1] = 0;
          local_1b48.y.n[2] = 0;
          local_1b48.y.n[3] = 0;
          local_1b48.y.n[4] = 0;
          local_1b48.z.n[0] = 0;
          local_1b48.z.n[1] = 0;
          local_1b48.z.n[2] = 0;
          local_1b48.z.n[3] = 0;
          local_1b48.z.n[4] = 0;
          testutil_random_scalar_order(&local_1868);
          psVar11 = &local_b38;
          lVar8 = 0;
          do {
            uVar4 = local_1868.d[3];
            uVar3 = local_1868.d[2];
            uVar2 = local_1868.d[1];
            *(uint64_t *)((long)local_1868.d + lVar8) = local_1868.d[0];
            *(uint64_t *)((long)local_1868.d + lVar8 + 8) = uVar2;
            *(uint64_t *)((long)local_1868.d + lVar8 + 0x10) = uVar3;
            *(uint64_t *)((long)local_1868.d + lVar8 + 0x18) = uVar4;
            testutil_random_ge_test((secp256k1_ge *)&local_f48);
            psVar13 = &local_f48;
            psVar15 = psVar11;
            for (lVar20 = 0xb; lVar20 != 0; lVar20 = lVar20 + -1) {
              (psVar15->x).n[0] = ((secp256k1_fe *)psVar13->wnaf_na_1)->n[0];
              psVar13 = (secp256k1_strauss_point_state *)((long)psVar13 + (ulong)bVar21 * -0x10 + 8)
              ;
              psVar15 = (secp256k1_ge *)((long)psVar15 + (ulong)bVar21 * -0x10 + 8);
            }
            secp256k1_gej_add_ge_var(&local_1b48,&local_1b48,psVar11,(secp256k1_fe *)0x0);
            lVar8 = lVar8 + 0x20;
            psVar11 = psVar11 + 1;
          } while (lVar8 != 0x280);
          local_1a48.x.n[0] = (uint64_t)local_1428;
          local_1a48.x.n[1] = (uint64_t)local_1268;
          local_1a48.x.n[2] = (uint64_t)&local_f48;
          secp256k1_ecmult_strauss_wnaf
                    ((secp256k1_strauss_state *)&local_1a48,&local_12e8,1,&local_1b48,&local_1868,
                     &secp256k1_scalar_zero);
          error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
          psVar9 = &secp256k1_scalar_zero;
          cb = ecmult_multi_callback;
          ppsVar17 = &local_1b90;
          psVar13 = (secp256k1_strauss_point_state *)scratch;
          iVar6 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                                  &secp256k1_scalar_zero,ecmult_multi_callback,ppsVar17,0x14);
          if (iVar6 == 0) goto LAB_0016bb31;
          secp256k1_gej_neg((secp256k1_gej *)&local_f48,&local_1b48);
          psVar9 = (secp256k1_scalar *)0x0;
          psVar13 = &local_f48;
          error_callback = &local_f48;
          secp256k1_gej_add_var
                    ((secp256k1_gej *)&local_f48,(secp256k1_gej *)&local_f48,&local_12e8,
                     (secp256k1_fe *)0x0);
          if (local_f48.wnaf_na_1[0x1e] == 0) goto LAB_0016bb36;
          iVar5 = iVar5 + 1;
        } while (iVar5 < COUNT);
        if (0 < COUNT) {
          iVar5 = 0;
          do {
            local_1ac8.x.n[2] = 0;
            local_1ac8.x.n[3] = 0;
            local_1ac8.x.n[0] = 0;
            local_1ac8.x.n[1] = 0;
            testutil_random_ge_test((secp256k1_ge *)&local_1968);
            psVar9 = &local_1868;
            lVar8 = 0;
            do {
              testutil_random_scalar_order(psVar9);
              psVar14 = &local_1968;
              puVar16 = (uint64_t *)((long)local_b38.x.n + lVar8);
              for (lVar20 = 0xb; lVar20 != 0; lVar20 = lVar20 + -1) {
                *puVar16 = (psVar14->x).n[0];
                psVar14 = (secp256k1_gej *)((long)psVar14 + (ulong)bVar21 * -0x10 + 8);
                puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
              }
              secp256k1_scalar_add
                        ((secp256k1_scalar *)&local_1ac8,(secp256k1_scalar *)&local_1ac8,psVar9);
              lVar8 = lVar8 + 0x58;
              psVar9 = psVar9 + 1;
            } while (lVar8 != 0x6e0);
            local_1a48.infinity = local_b38.infinity;
            local_1a48.x.n[4] = local_b38.x.n[4];
            local_1a48.x.n[2] = local_b38.x.n[2];
            local_1a48.x.n[3] = local_b38.x.n[3];
            local_1a48.x.n[0] = local_b38.x.n[0];
            local_1a48.x.n[1] = local_b38.x.n[1];
            local_1a48.y.n[4] = local_b38.y.n[4];
            local_1a48.y.n[2] = local_b38.y.n[2];
            local_1a48.y.n[3] = local_b38.y.n[3];
            local_1a48.y.n[0] = local_b38.y.n[0];
            local_1a48.y.n[1] = local_b38.y.n[1];
            local_1a48.z.n[0] = 1;
            local_1a48.z.n[3] = 0;
            local_1a48.z.n[4] = 0;
            local_1a48.z.n[1] = 0;
            local_1a48.z.n[2] = 0;
            local_18e8.x.n[0] = (uint64_t)local_1428;
            local_18e8.x.n[1] = (uint64_t)local_1268;
            local_18e8.x.n[2] = (uint64_t)&local_f48;
            secp256k1_ecmult_strauss_wnaf
                      ((secp256k1_strauss_state *)&local_18e8,&local_12e8,1,&local_1a48,
                       (secp256k1_scalar *)&local_1ac8,&secp256k1_scalar_zero);
            error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
            psVar9 = &secp256k1_scalar_zero;
            cb = ecmult_multi_callback;
            ppsVar17 = &local_1b90;
            psVar13 = (secp256k1_strauss_point_state *)scratch;
            iVar6 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                                    &secp256k1_scalar_zero,ecmult_multi_callback,ppsVar17,0x14);
            if (iVar6 == 0) goto LAB_0016bb40;
            secp256k1_gej_neg((secp256k1_gej *)&local_f48,&local_1b48);
            psVar9 = (secp256k1_scalar *)0x0;
            psVar13 = &local_f48;
            error_callback = &local_f48;
            secp256k1_gej_add_var
                      ((secp256k1_gej *)&local_f48,(secp256k1_gej *)&local_f48,&local_12e8,
                       (secp256k1_fe *)0x0);
            if (local_f48.wnaf_na_1[0x1e] == 0) goto LAB_0016bb45;
            iVar5 = iVar5 + 1;
          } while (iVar5 < COUNT);
        }
      }
    }
  }
  lVar8 = 0;
  psVar11 = &local_b38;
  do {
    testutil_random_scalar_order((secp256k1_scalar *)((long)local_1868.d + lVar8));
    testutil_random_ge_test(psVar11);
    psVar11 = psVar11 + 1;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0x280);
  local_1868.d[2] = 0;
  local_1868.d[3] = 0;
  local_1868.d[0] = 0;
  local_1868.d[1] = 0;
  error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
  psVar9 = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  ppsVar17 = &local_1b90;
  psVar13 = (secp256k1_strauss_point_state *)scratch;
  iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                          &secp256k1_scalar_zero,ecmult_multi_callback,ppsVar17,0x14);
  if (iVar5 == 0) goto LAB_0016bb4a;
  local_17d8 = 0;
  uStack_17d0 = 0;
  local_17e8 = 0;
  uStack_17e0 = 0;
  local_17f8 = 0;
  uStack_17f0 = 0;
  local_1808 = 0;
  uStack_1800 = 0;
  local_1818 = 0;
  uStack_1810 = 0;
  local_1828 = 0;
  uStack_1820 = 0;
  local_1848.d[2] = 0;
  local_1848.d[3] = 0;
  local_1848.d[0] = 0;
  local_1848.d[1] = 0;
  error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
  psVar9 = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  ppsVar17 = &local_1b90;
  psVar13 = (secp256k1_strauss_point_state *)scratch;
  iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                          &secp256k1_scalar_zero,ecmult_multi_callback,ppsVar17,6);
  if (iVar5 == 0) goto LAB_0016bb4f;
  error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
  psVar9 = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  ppsVar17 = &local_1b90;
  psVar13 = (secp256k1_strauss_point_state *)scratch;
  iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                          &secp256k1_scalar_zero,ecmult_multi_callback,ppsVar17,5);
  if (iVar5 != 0) {
    if (local_1b48.infinity != 0) {
      testutil_random_ge_test(&local_fa0);
      local_1a48.infinity = local_fa0.infinity;
      local_1a48.x.n[0] = local_fa0.x.n[0];
      local_1a48.x.n[1] = local_fa0.x.n[1];
      local_1a48.x.n[2] = local_fa0.x.n[2];
      local_1a48.x.n[3] = local_fa0.x.n[3];
      local_1a48.x.n[4] = local_fa0.x.n[4];
      local_1a48.y.n[0] = local_fa0.y.n[0];
      local_1a48.y.n[1] = local_fa0.y.n[1];
      local_1a48.y.n[2] = local_fa0.y.n[2];
      local_1a48.y.n[3] = local_fa0.y.n[3];
      local_1a48.y.n[4] = local_fa0.y.n[4];
      local_1a48.z.n[0] = 1;
      local_1a48.z.n[1] = 0;
      local_1a48.z.n[2] = 0;
      local_1a48.z.n[3] = 0;
      local_1a48.z.n[4] = 0;
      local_1b78 = 0;
      do {
        local_1b70 = local_1b78 + 1 >> 1;
        local_1b68 = (ulong)((uint)local_1b78 & 1);
        uVar12 = 0;
        local_1b78 = local_1b78 + 1;
        do {
          local_1988.d[3] = 0;
          local_1988.d[1] = 0;
          local_1988.d[2] = 0;
          local_1988.d[0] = local_1b70;
          secp256k1_scalar_cond_negate(&local_1988,(int)local_1b68);
          local_1b60 = uVar12 + 1;
          local_19c0.d[0] = local_1b60 >> 1;
          local_19c0.d[1] = 0;
          local_19c0.d[2] = 0;
          local_19c0.d[3] = 0;
          secp256k1_scalar_cond_negate(&local_19c0,(uint)uVar12 & 1);
          local_1ac8.x.n[0] = (uint64_t)local_1428;
          local_1ac8.x.n[1] = (uint64_t)local_1268;
          local_1ac8.x.n[2] = (uint64_t)&local_f48;
          secp256k1_ecmult_strauss_wnaf
                    ((secp256k1_strauss_state *)&local_1ac8,&local_1968,1,&local_1a48,&local_1988,
                     &secp256k1_scalar_zero);
          local_18e8.x.n[0] = (uint64_t)local_1428;
          local_18e8.x.n[1] = (uint64_t)local_1268;
          local_18e8.x.n[2] = (uint64_t)&local_f48;
          secp256k1_ecmult_strauss_wnaf
                    ((secp256k1_strauss_state *)&local_18e8,&local_1ac8,1,&local_1a48,&local_19c0,
                     &secp256k1_scalar_zero);
          local_1b58 = 0;
          do {
            local_1b50 = local_1b58 + 1 >> 1;
            local_1b80 = (secp256k1_scalar *)(ulong)((uint)local_1b58 & 1);
            uVar12 = 0;
            local_1b58 = local_1b58 + 1;
            do {
              secp256k1_ge_set_gej(&local_b38,&local_1968);
              secp256k1_ge_set_gej(local_ae0,&local_1ac8);
              local_1868.d[0] = local_1b50;
              local_1868.d[3] = 0;
              local_1868.d[1] = 0;
              local_1868.d[2] = 0;
              secp256k1_scalar_cond_negate(&local_1868,(int)local_1b80);
              uVar19 = uVar12 + 1;
              local_1848.d[0] = uVar19 >> 1;
              local_1848.d[1] = 0;
              local_1848.d[2] = 0;
              local_1848.d[3] = 0;
              secp256k1_scalar_cond_negate(&local_1848,(uint)uVar12 & 1);
              secp256k1_scalar_mul(&local_1448,&local_1988,&local_1868);
              secp256k1_scalar_mul(&local_1468,&local_19c0,&local_1848);
              secp256k1_scalar_add(&local_1448,&local_1448,&local_1468);
              local_19a0.aux = local_1428;
              local_19a0.pre_a = (secp256k1_ge *)local_1268;
              local_19a0.ps = &local_f48;
              secp256k1_ecmult_strauss_wnaf
                        (&local_19a0,&local_18e8,1,&local_1a48,&local_1448,&secp256k1_scalar_zero);
              error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
              psVar9 = &secp256k1_scalar_zero;
              cb = ecmult_multi_callback;
              ppsVar17 = &local_1b90;
              psVar13 = (secp256k1_strauss_point_state *)scratch;
              iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,local_1268,
                                      &secp256k1_scalar_zero,ecmult_multi_callback,ppsVar17,2);
              if (iVar5 == 0) {
                test_ecmult_multi_cold_3();
LAB_0016bacd:
                test_ecmult_multi_cold_2();
                goto LAB_0016bad2;
              }
              secp256k1_gej_neg((secp256k1_gej *)&local_f48,local_1268);
              psVar9 = (secp256k1_scalar *)0x0;
              psVar13 = &local_f48;
              error_callback = &local_f48;
              secp256k1_gej_add_var
                        ((secp256k1_gej *)&local_f48,(secp256k1_gej *)&local_f48,&local_18e8,
                         (secp256k1_fe *)0x0);
              if (local_f48.wnaf_na_1[0x1e] == 0) goto LAB_0016bacd;
              uVar12 = uVar19;
            } while (uVar19 != 8);
          } while (local_1b58 != 8);
          uVar12 = local_1b60;
        } while (local_1b60 != 8);
        if (local_1b78 == 8) {
          return;
        }
      } while( true );
    }
    goto LAB_0016bb59;
  }
  goto LAB_0016bb54;
LAB_0016bad2:
  test_ecmult_multi_cold_21();
LAB_0016bad7:
  test_ecmult_multi_cold_20();
LAB_0016badc:
  test_ecmult_multi_cold_19();
LAB_0016bae1:
  test_ecmult_multi_cold_18();
LAB_0016bae6:
  test_ecmult_multi_cold_17();
LAB_0016baeb:
  test_ecmult_multi_cold_16();
LAB_0016baf0:
  test_ecmult_multi_cold_15();
LAB_0016baf5:
  test_ecmult_multi_cold_14();
LAB_0016bafa:
  test_ecmult_multi_cold_29();
LAB_0016baff:
  ppsVar18 = ppsVar17;
  test_ecmult_multi_cold_28();
LAB_0016bb04:
  test_ecmult_multi_cold_27();
LAB_0016bb09:
  test_ecmult_multi_cold_26();
LAB_0016bb0e:
  test_ecmult_multi_cold_1();
LAB_0016bb13:
  test_ecmult_multi_cold_25();
LAB_0016bb18:
  ppsVar17 = ppsVar18;
  test_ecmult_multi_cold_24();
LAB_0016bb1d:
  test_ecmult_multi_cold_23();
LAB_0016bb22:
  test_ecmult_multi_cold_22();
LAB_0016bb27:
  test_ecmult_multi_cold_13();
LAB_0016bb2c:
  test_ecmult_multi_cold_12();
LAB_0016bb31:
  test_ecmult_multi_cold_11();
LAB_0016bb36:
  test_ecmult_multi_cold_10();
LAB_0016bb3b:
  test_ecmult_multi_cold_30();
LAB_0016bb40:
  test_ecmult_multi_cold_9();
LAB_0016bb45:
  test_ecmult_multi_cold_8();
LAB_0016bb4a:
  test_ecmult_multi_cold_7();
LAB_0016bb4f:
  test_ecmult_multi_cold_6();
LAB_0016bb54:
  test_ecmult_multi_cold_5();
LAB_0016bb59:
  test_ecmult_multi_cold_4();
  secp256k1_ecmult_pippenger_batch
            ((secp256k1_callback *)error_callback,(secp256k1_scratch *)psVar13,r_00,psVar9,cb,
             ppsVar17,(size_t)scratch,0);
  return;
}

Assistant:

static void test_ecmult_multi(secp256k1_scratch *scratch, secp256k1_ecmult_multi_func ecmult_multi) {
    int ncount;
    secp256k1_scalar sc[32];
    secp256k1_ge pt[32];
    secp256k1_gej r;
    secp256k1_gej r2;
    ecmult_multi_data data;

    data.sc = sc;
    data.pt = pt;

    /* No points to multiply */
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, NULL, ecmult_multi_callback, &data, 0));

    /* Check 1- and 2-point multiplies against ecmult */
    for (ncount = 0; ncount < COUNT; ncount++) {
        secp256k1_ge ptg;
        secp256k1_gej ptgj;
        testutil_random_scalar_order(&sc[0]);
        testutil_random_scalar_order(&sc[1]);

        testutil_random_ge_test(&ptg);
        secp256k1_gej_set_ge(&ptgj, &ptg);
        pt[0] = ptg;
        pt[1] = secp256k1_ge_const_g;

        /* only G scalar */
        secp256k1_ecmult(&r2, &ptgj, &secp256k1_scalar_zero, &sc[0]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &sc[0], ecmult_multi_callback, &data, 0));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* 1-point */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 1));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* Try to multiply 1 point, but callback returns false */
        CHECK(!ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_false_callback, &data, 1));

        /* 2-point */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &sc[1]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* 2-point with G scalar */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &sc[1]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &sc[1], ecmult_multi_callback, &data, 1));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Check infinite outputs of various forms */
    for (ncount = 0; ncount < COUNT; ncount++) {
        secp256k1_ge ptg;
        size_t i, j;
        size_t sizes[] = { 2, 10, 32 };

        for (j = 0; j < 3; j++) {
            for (i = 0; i < 32; i++) {
                testutil_random_scalar_order(&sc[i]);
                secp256k1_ge_set_infinity(&pt[i]);
            }
            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        for (j = 0; j < 3; j++) {
            for (i = 0; i < 32; i++) {
                testutil_random_ge_test(&ptg);
                pt[i] = ptg;
                secp256k1_scalar_set_int(&sc[i], 0);
            }
            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        for (j = 0; j < 3; j++) {
            testutil_random_ge_test(&ptg);
            for (i = 0; i < 16; i++) {
                testutil_random_scalar_order(&sc[2*i]);
                secp256k1_scalar_negate(&sc[2*i + 1], &sc[2*i]);
                pt[2 * i] = ptg;
                pt[2 * i + 1] = ptg;
            }

            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));

            testutil_random_scalar_order(&sc[0]);
            for (i = 0; i < 16; i++) {
                testutil_random_ge_test(&ptg);

                sc[2*i] = sc[0];
                sc[2*i+1] = sc[0];
                pt[2 * i] = ptg;
                secp256k1_ge_neg(&pt[2*i+1], &pt[2*i]);
            }

            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        testutil_random_ge_test(&ptg);
        secp256k1_scalar_set_int(&sc[0], 0);
        pt[0] = ptg;
        for (i = 1; i < 32; i++) {
            pt[i] = ptg;

            testutil_random_scalar_order(&sc[i]);
            secp256k1_scalar_add(&sc[0], &sc[0], &sc[i]);
            secp256k1_scalar_negate(&sc[i], &sc[i]);
        }

        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 32));
        CHECK(secp256k1_gej_is_infinity(&r));
    }

    /* Check random points, constant scalar */
    for (ncount = 0; ncount < COUNT; ncount++) {
        size_t i;
        secp256k1_gej_set_infinity(&r);

        testutil_random_scalar_order(&sc[0]);
        for (i = 0; i < 20; i++) {
            secp256k1_ge ptg;
            sc[i] = sc[0];
            testutil_random_ge_test(&ptg);
            pt[i] = ptg;
            secp256k1_gej_add_ge_var(&r, &r, &pt[i], NULL);
        }

        secp256k1_ecmult(&r2, &r, &sc[0], &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Check random scalars, constant point */
    for (ncount = 0; ncount < COUNT; ncount++) {
        size_t i;
        secp256k1_ge ptg;
        secp256k1_gej p0j;
        secp256k1_scalar rs;
        secp256k1_scalar_set_int(&rs, 0);

        testutil_random_ge_test(&ptg);
        for (i = 0; i < 20; i++) {
            testutil_random_scalar_order(&sc[i]);
            pt[i] = ptg;
            secp256k1_scalar_add(&rs, &rs, &sc[i]);
        }

        secp256k1_gej_set_ge(&p0j, &pt[0]);
        secp256k1_ecmult(&r2, &p0j, &rs, &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Sanity check that zero scalars don't cause problems */
    for (ncount = 0; ncount < 20; ncount++) {
        testutil_random_scalar_order(&sc[ncount]);
        testutil_random_ge_test(&pt[ncount]);
    }

    secp256k1_scalar_clear(&sc[0]);
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
    secp256k1_scalar_clear(&sc[1]);
    secp256k1_scalar_clear(&sc[2]);
    secp256k1_scalar_clear(&sc[3]);
    secp256k1_scalar_clear(&sc[4]);
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 6));
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 5));
    CHECK(secp256k1_gej_is_infinity(&r));

    /* Run through s0*(t0*P) + s1*(t1*P) exhaustively for many small values of s0, s1, t0, t1 */
    {
        const size_t TOP = 8;
        size_t s0i, s1i;
        size_t t0i, t1i;
        secp256k1_ge ptg;
        secp256k1_gej ptgj;

        testutil_random_ge_test(&ptg);
        secp256k1_gej_set_ge(&ptgj, &ptg);

        for(t0i = 0; t0i < TOP; t0i++) {
            for(t1i = 0; t1i < TOP; t1i++) {
                secp256k1_gej t0p, t1p;
                secp256k1_scalar t0, t1;

                secp256k1_scalar_set_int(&t0, (t0i + 1) / 2);
                secp256k1_scalar_cond_negate(&t0, t0i & 1);
                secp256k1_scalar_set_int(&t1, (t1i + 1) / 2);
                secp256k1_scalar_cond_negate(&t1, t1i & 1);

                secp256k1_ecmult(&t0p, &ptgj, &t0, &secp256k1_scalar_zero);
                secp256k1_ecmult(&t1p, &ptgj, &t1, &secp256k1_scalar_zero);

                for(s0i = 0; s0i < TOP; s0i++) {
                    for(s1i = 0; s1i < TOP; s1i++) {
                        secp256k1_scalar tmp1, tmp2;
                        secp256k1_gej expected, actual;

                        secp256k1_ge_set_gej(&pt[0], &t0p);
                        secp256k1_ge_set_gej(&pt[1], &t1p);

                        secp256k1_scalar_set_int(&sc[0], (s0i + 1) / 2);
                        secp256k1_scalar_cond_negate(&sc[0], s0i & 1);
                        secp256k1_scalar_set_int(&sc[1], (s1i + 1) / 2);
                        secp256k1_scalar_cond_negate(&sc[1], s1i & 1);

                        secp256k1_scalar_mul(&tmp1, &t0, &sc[0]);
                        secp256k1_scalar_mul(&tmp2, &t1, &sc[1]);
                        secp256k1_scalar_add(&tmp1, &tmp1, &tmp2);

                        secp256k1_ecmult(&expected, &ptgj, &tmp1, &secp256k1_scalar_zero);
                        CHECK(ecmult_multi(&CTX->error_callback, scratch, &actual, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2));
                        CHECK(secp256k1_gej_eq_var(&actual, &expected));
                    }
                }
            }
        }
    }
}